

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRTrackerEvent.cpp
# Opt level: O2

float * __thiscall MinVR::VRTrackerEvent::getTransform(VRTrackerEvent *this)

{
  VRDataIndex *pVVar1;
  bool bVar2;
  int iVar3;
  VRAnyCoreType VVar4;
  undefined4 extraout_var;
  VRError *this_00;
  allocator<char> local_11f;
  allocator<char> local_11e;
  allocator<char> local_11d;
  int local_11c;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pVVar1 = this->_index;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Transform",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"",(allocator<char> *)&local_f8);
  bVar2 = VRDataIndex::exists(pVVar1,&local_118,&local_98,true);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_118);
  if (bVar2) {
    pVVar1 = this->_index;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Transform",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"",(allocator<char> *)&local_f8);
    VVar4 = VRDataIndex::getValue(pVVar1,&local_118,&local_b8,true);
    iVar3 = (*(VVar4.datum)->_vptr_VRDatum[0xe])(VVar4.datum);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_118);
    return *(float **)CONCAT44(extraout_var,iVar3);
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::__cxx11::string::string((string *)&local_f8,(string *)&this->_index->_indexName);
  std::operator+(&local_d8,
                 "VRTrackerEvent::getTransform() cannot determine a data field to return for event named "
                 ,&local_f8);
  std::operator+(&local_118,&local_d8,".");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "Tracker_Move events should have an entry in their data index called Transform.",
             &local_11d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/api/impl/VRTrackerEvent.cpp"
             ,&local_11e);
  local_11c = 0x26;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"const float *MinVR::VRTrackerEvent::getTransform() const",
             &local_11f);
  VRError::VRError(this_00,&local_118,&local_38,&local_58,&local_11c,&local_78);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

const float * VRTrackerEvent::getTransform() const {
    if (_index.exists("Transform")) {
        const std::vector<float> *v = _index.getValue("Transform");
        return &(v->front());
    }
    else {
        VRERROR("VRTrackerEvent::getTransform() cannot determine a data field to return for event named " +
                _index.getName() + ".", "Tracker_Move events should have an entry in their data index called Transform.");
        return NULL;
    }
}